

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O0

void Shr_ManComputeTruths
               (Gia_Man_t *p,int nVars,Vec_Int_t *vDivs,Vec_Wrd_t *vDivTruths,Vec_Wrd_t *vTruths)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  int local_4c;
  int iDiv;
  int i;
  word Truth1;
  word Truth0;
  Gia_Obj_t *pObj;
  Vec_Wrd_t *vTruths_local;
  Vec_Wrd_t *vDivTruths_local;
  Vec_Int_t *vDivs_local;
  int nVars_local;
  Gia_Man_t *p_local;
  
  Vec_WrdClear(vDivTruths);
  for (local_4c = 0; iVar1 = nVars, local_4c < nVars; local_4c = local_4c + 1) {
    iVar1 = Vec_IntEntry(vDivs,local_4c);
    Vec_WrdWriteEntry(vTruths,iVar1,Truth[local_4c]);
    Vec_WrdPush(vDivTruths,Truth[local_4c]);
  }
  while (local_4c = iVar1, iVar1 = Vec_IntSize(vDivs), local_4c < iVar1) {
    iVar1 = Vec_IntEntry(vDivs,local_4c);
    pObj_00 = Gia_ManObj(p,iVar1);
    iVar2 = Gia_ObjFaninId0(pObj_00,iVar1);
    Truth1 = Vec_WrdEntry(vTruths,iVar2);
    iVar2 = Gia_ObjFaninId1(pObj_00,iVar1);
    _iDiv = Vec_WrdEntry(vTruths,iVar2);
    iVar2 = Gia_ObjFaninC0(pObj_00);
    if (iVar2 != 0) {
      Truth1 = Truth1 ^ 0xffffffffffffffff;
    }
    iVar2 = Gia_ObjFaninC1(pObj_00);
    if (iVar2 != 0) {
      _iDiv = _iDiv ^ 0xffffffffffffffff;
    }
    Vec_WrdWriteEntry(vTruths,iVar1,Truth1 & _iDiv);
    Vec_WrdPush(vDivTruths,Truth1 & _iDiv);
    iVar1 = local_4c + 1;
  }
  return;
}

Assistant:

void Shr_ManComputeTruths( Gia_Man_t * p, int nVars, Vec_Int_t * vDivs, Vec_Wrd_t * vDivTruths, Vec_Wrd_t * vTruths )
{
    Gia_Obj_t * pObj;
    word Truth0, Truth1;//, Truthh;
    int i, iDiv;
    Vec_WrdClear( vDivTruths );
    Vec_IntForEachEntryStop( vDivs, iDiv, i, nVars )
    {
        Vec_WrdWriteEntry( vTruths, iDiv, Truth[i] );
        Vec_WrdPush( vDivTruths, Truth[i] );
    }
    Vec_IntForEachEntryStart( vDivs, iDiv, i, nVars )
    {
        pObj = Gia_ManObj( p, iDiv );
        Truth0 = Vec_WrdEntry( vTruths, Gia_ObjFaninId0(pObj, iDiv) );
        Truth1 = Vec_WrdEntry( vTruths, Gia_ObjFaninId1(pObj, iDiv) );
        if ( Gia_ObjFaninC0(pObj) )
            Truth0 = ~Truth0;
        if ( Gia_ObjFaninC1(pObj) )
            Truth1 = ~Truth1;
        Vec_WrdWriteEntry( vTruths, iDiv, Truth0 & Truth1 );
        Vec_WrdPush( vDivTruths, Truth0 & Truth1 );

//        Truthh = Truth0 & Truth1;
//        Abc_TtPrintBinary( &Truthh, nVars );   //printf( "\n" );
//        Kit_DsdPrintFromTruth( &Truthh, nVars );    printf( "\n" );
    }
//    printf( "\n" );
}